

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.hpp
# Opt level: O0

void __thiscall
optimization::inlineFunc::Inline_Func::optimize_func
          (Inline_Func *this,string *funcId,MirFunction *func,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
          *funcTable)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  pointer ppVar4;
  ulong uVar5;
  size_type sVar6;
  pointer pIVar7;
  size_type sVar8;
  size_t sVar9;
  ostream *poVar10;
  mapped_type *pmVar11;
  long in_RDX;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar12;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar13;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *j_7;
  iterator __end5_6;
  iterator __begin5_6;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *__range5_6;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *j_6;
  iterator __end5_5;
  iterator __begin5_5;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *__range5_5;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *j_5;
  iterator __end5_4;
  iterator __begin5_4;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *__range5_4;
  int j_4;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  start_blk_insts;
  mapped_type *blk_1;
  int bb_false;
  mapped_type *blk;
  int bb_true;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *j_3;
  iterator __end5_3;
  iterator __begin5_3;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *__range5_3;
  int j_2;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *j_1;
  iterator __end5_2;
  iterator __begin5_2;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *__range5_2;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *j;
  iterator __end5_1;
  iterator __begin5_1;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *__range5_1;
  mapped_type *end_blk;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  end_blk_insts;
  mapped_type *start_blk;
  mapped_type sub_end_id;
  iterator end_iter;
  mapped_type sub_start_id;
  pair<const_int,_mir::inst::BasicBlk> *pair;
  iterator __end5;
  iterator __begin5;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *__range5;
  Rewriter rwt;
  mapped_type *subfunc;
  CallInst *callInst;
  Inst *iptr;
  value_type *inst;
  int i;
  BasicBlk *cur_blk;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *insts;
  bool flag;
  iterator iter_1;
  pair<const_int,_mir::inst::BasicBlk> *iter;
  iterator __end2;
  iterator __begin2;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *__range2;
  set<int,_std::less<int>,_std::allocator<int>_> base_labels;
  int cur_blkId;
  JumpInstruction *in_stack_fffffffffffff998;
  Rewriter *in_stack_fffffffffffff9a0;
  JumpInstructionKind in_stack_fffffffffffff9a8;
  int in_stack_fffffffffffff9ac;
  int in_stack_fffffffffffff9b0;
  int in_stack_fffffffffffff9b4;
  _Rb_tree_const_iterator<int> in_stack_fffffffffffff9b8;
  MirFunction *in_stack_fffffffffffff9c0;
  undefined7 in_stack_fffffffffffff9c8;
  undefined1 in_stack_fffffffffffff9cf;
  _Rb_tree_const_iterator<int> in_stack_fffffffffffff9d0;
  mapped_type *in_stack_fffffffffffff9d8;
  undefined4 in_stack_fffffffffffff9e0;
  JumpInstructionKind in_stack_fffffffffffff9e4;
  Timestamp *in_stack_fffffffffffffa28;
  ostream *in_stack_fffffffffffffa30;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffa98;
  undefined8 local_540;
  _Self local_508 [4];
  undefined1 local_4e8 [72];
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  local_4a0;
  _Rb_tree_node_base *local_498;
  _Base_ptr local_490;
  _Base_ptr local_488;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  local_480;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *local_478;
  reference local_470;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_468;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  local_460;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_458;
  int local_44c;
  _Rb_tree_node_base local_448;
  undefined1 local_428;
  MirFunction *local_420;
  int local_414;
  _Base_ptr local_410;
  undefined1 local_408;
  mapped_type *local_400;
  int local_3f4;
  JumpInstruction local_3d8;
  reference local_3a0;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_398;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  local_390;
  undefined1 *local_388;
  int in_stack_fffffffffffffc84;
  CallInst *in_stack_fffffffffffffc88;
  iterator in_stack_fffffffffffffc90;
  iterator in_stack_fffffffffffffc98;
  Rewriter *in_stack_fffffffffffffca0;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  local_348;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *local_340;
  _Base_ptr local_338;
  undefined1 local_330;
  mapped_type *local_328;
  undefined1 local_320 [24];
  mapped_type *local_308;
  mapped_type local_2fc;
  _Base_ptr local_2f8;
  _Base_ptr local_2f0;
  _Base_ptr local_2e8;
  mapped_type local_2dc;
  reference local_2d8;
  _Self local_2d0;
  _Self local_2c8;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *local_2c0;
  ostream local_278 [48];
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> auStack_248 [3];
  undefined1 auStack_230 [56];
  string local_1f8 [39];
  allocator<char> local_1d1;
  string local_1d0 [120];
  time_point_sys_clock local_158;
  Timestamp local_150 [3];
  undefined1 local_101;
  _Base_ptr local_100;
  undefined1 local_f8;
  mapped_type *local_f0;
  undefined8 local_e8;
  type local_e0;
  reference local_d8;
  int local_cc;
  BasicBlk *local_c8;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *local_c0;
  byte local_b1;
  _Self local_b0;
  _Self local_a8;
  _Base_ptr local_a0;
  undefined1 local_98;
  reference local_80;
  _Self local_78;
  _Self local_70;
  long local_68;
  _Base_ptr local_30;
  int local_24;
  long local_18;
  
  local_18 = in_RDX;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff9a0,(char *)in_stack_fffffffffffff998);
  if ((!bVar1) &&
     (peVar3 = std::
               __shared_ptr_access<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1559f4), (peVar3->is_extern & 1U) == 0)) {
    local_30 = (_Base_ptr)
               std::
               map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
               ::begin((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                        *)in_stack_fffffffffffff998);
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x155a25);
    local_24 = ppVar4->first;
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)0x155a3b);
    local_68 = local_18 + 0x68;
    local_70._M_node =
         (_Base_ptr)
         std::
         map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
         ::begin((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                  *)in_stack_fffffffffffff998);
    local_78._M_node =
         (_Base_ptr)
         std::
         map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
         ::end((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                *)in_stack_fffffffffffff998);
    while (bVar1 = std::operator!=(&local_70,&local_78), bVar1) {
      local_80 = std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator*
                           ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
                            0x155aa4);
      pVar13 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)
                          in_stack_fffffffffffff9c0,
                          (value_type_conflict3 *)in_stack_fffffffffffff9b8._M_node);
      local_a0 = (_Base_ptr)pVar13.first._M_node;
      local_98 = pVar13.second;
      std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
                 in_stack_fffffffffffff9a0);
    }
    do {
      local_a8._M_node =
           (_Base_ptr)
           std::
           map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
           ::begin((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                    *)in_stack_fffffffffffff998);
      while( true ) {
        local_b0._M_node =
             (_Base_ptr)
             std::
             map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
             ::end((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                    *)in_stack_fffffffffffff998);
        bVar1 = std::operator!=(&local_a8,&local_b0);
        if (!bVar1) break;
        local_b1 = 0;
        ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                           ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
                            0x155b84);
        if (local_24 <= ppVar4->first) {
          ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                             ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
                              0x155ba1);
          local_c0 = &(ppVar4->second).inst;
          ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                             ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
                              0x155bbe);
          local_c8 = &ppVar4->second;
          local_cc = 0;
LAB_00155bd5:
          uVar5 = (ulong)local_cc;
          sVar6 = std::
                  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                  ::size(local_c0);
          if (uVar5 < sVar6) {
            local_d8 = std::
                       vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                       ::operator[](local_c0,(long)local_cc);
            pIVar7 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::
                     operator->((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                 *)0x155c30);
            iVar2 = (*(pIVar7->super_Displayable)._vptr_Displayable[1])();
            if (iVar2 != 6) goto LAB_00156b13;
            local_e0 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::
                       operator*((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                  *)in_stack_fffffffffffff9a0);
            if (local_e0 == (type)0x0) {
              local_540 = 0;
            }
            else {
              local_540 = __dynamic_cast(local_e0,&mir::inst::Inst::typeinfo,
                                         &mir::inst::CallInst::typeinfo,0);
            }
            local_e8 = local_540;
            local_f0 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
                       ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
                             *)in_stack_fffffffffffff9c0,
                            (key_type *)in_stack_fffffffffffff9b8._M_node);
            sVar8 = std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                            (key_type *)
                            CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
            if ((sVar8 != 0) ||
               (peVar3 = std::
                         __shared_ptr_access<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x155d44), (peVar3->is_extern & 1U) != 0))
            goto LAB_00156b13;
            sVar9 = mir::inst::MirFunction::variable_table_size(in_stack_fffffffffffff9c0);
            poVar10 = (ostream *)
                      mir::inst::MirFunction::variable_table_size(in_stack_fffffffffffff9c0);
            if ((ostream *)0x3ff < poVar10 + sVar9) {
              pVar12 = std::
                       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)in_stack_fffffffffffff9c0,
                                (value_type *)in_stack_fffffffffffff9b8._M_node);
              in_stack_fffffffffffffa98 = pVar12.first._M_node;
              local_f8 = pVar12.second;
              local_100 = in_stack_fffffffffffffa98._M_node;
              goto LAB_00156b13;
            }
            local_101 = 0;
            AixLog::operator<<(poVar10,(Severity *)in_stack_fffffffffffffa98._M_node);
            AixLog::Tag::Tag((Tag *)0x155e1c);
            AixLog::operator<<((ostream *)in_stack_fffffffffffff9d0._M_node,
                               (Tag *)CONCAT17(in_stack_fffffffffffff9cf,in_stack_fffffffffffff9c8))
            ;
            local_158.__d.__r = (duration)std::chrono::_V2::system_clock::now();
            AixLog::Timestamp::Timestamp(local_150,&local_158);
            AixLog::operator<<(in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                       (char *)in_stack_fffffffffffff9d8,
                       (allocator<char> *)in_stack_fffffffffffff9d0._M_node);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                       (char *)in_stack_fffffffffffff9d8,
                       (allocator<char> *)in_stack_fffffffffffff9d0._M_node);
            AixLog::Function::Function
                      ((Function *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                       (string *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                       (string *)in_stack_fffffffffffff9a0,(size_t)in_stack_fffffffffffff998);
            poVar10 = AixLog::operator<<((ostream *)in_stack_fffffffffffff9d0._M_node,
                                         (Function *)
                                         CONCAT17(in_stack_fffffffffffff9cf,
                                                  in_stack_fffffffffffff9c8));
            poVar10 = std::operator<<(poVar10,"( inline_func ) ");
            poVar10 = std::operator<<(poVar10,(string *)(local_18 + 8));
            poVar10 = std::operator<<(poVar10," inlines ");
            poVar10 = std::operator<<(poVar10,(string *)&local_f0->name);
            std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
            AixLog::Function::~Function((Function *)in_stack_fffffffffffff9a0);
            std::__cxx11::string::~string(local_1f8);
            std::allocator<char>::~allocator((allocator<char> *)(auStack_230 + 0x37));
            std::__cxx11::string::~string(local_1d0);
            std::allocator<char>::~allocator(&local_1d1);
            AixLog::Timestamp::~Timestamp(local_150);
            AixLog::Tag::~Tag((Tag *)0x15601c);
            Rewriter::Rewriter(in_stack_fffffffffffffca0,
                               (MirFunction *)in_stack_fffffffffffffc98._M_current,
                               (MirFunction *)in_stack_fffffffffffffc90._M_current,
                               in_stack_fffffffffffffc88,in_stack_fffffffffffffc84);
            local_2c0 = &local_f0->basic_blks;
            local_2c8._M_node =
                 (_Base_ptr)
                 std::
                 map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                 ::begin((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                          *)in_stack_fffffffffffff998);
            local_2d0._M_node =
                 (_Base_ptr)
                 std::
                 map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                 ::end((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                        *)in_stack_fffffffffffff998);
            while (bVar1 = std::operator!=(&local_2c8,&local_2d0), bVar1) {
              local_2d8 = std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::
                          operator*((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *
                                    )0x1560b8);
              Rewriter::cast_block
                        ((Rewriter *)rwt._160_8_,
                         (BasicBlk *)
                         rwt.init_inst_after.
                         super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator++
                        ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
                         in_stack_fffffffffffff9a0);
            }
            in_stack_fffffffffffffa30 = local_278;
            local_2e8 = (_Base_ptr)
                        std::
                        map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                        ::begin((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                                 *)in_stack_fffffffffffff998);
            std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x156223);
            pmVar11 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)in_stack_fffffffffffff9c0,
                                 (key_type *)in_stack_fffffffffffff9b8._M_node);
            local_2dc = *pmVar11;
            local_2f0 = (_Base_ptr)
                        std::
                        map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                        ::end((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                               *)in_stack_fffffffffffff998);
            local_2f8 = (_Base_ptr)
                        std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::
                        operator--((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
                                   CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                                   (int)((ulong)in_stack_fffffffffffff9a0 >> 0x20));
            std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x1562a3);
            in_stack_fffffffffffffa28 =
                 (Timestamp *)
                 std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                           ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)in_stack_fffffffffffff9c0,
                            (key_type *)in_stack_fffffffffffff9b8._M_node);
            local_2fc = *(mapped_type *)&in_stack_fffffffffffffa28->_vptr_Timestamp;
            local_308 = std::
                        map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                        ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                              *)in_stack_fffffffffffff9c0,
                             (key_type *)in_stack_fffffffffffff9b8._M_node);
            std::
            vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ::vector((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      *)0x156308);
            local_328 = std::
                        map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                        ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                              *)in_stack_fffffffffffff9c0,
                             (key_type *)in_stack_fffffffffffff9b8._M_node);
            pVar13 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                               ((set<int,_std::less<int>,_std::allocator<int>_> *)
                                in_stack_fffffffffffff9c0,
                                (value_type_conflict3 *)in_stack_fffffffffffff9b8._M_node);
            local_338 = (_Base_ptr)pVar13.first._M_node;
            local_330 = pVar13.second;
            local_340 = &local_328->inst;
            local_348._M_current =
                 (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                 std::
                 vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                 ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                          *)in_stack_fffffffffffff998);
            std::
            vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ::end((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                   *)in_stack_fffffffffffff998);
            while (bVar1 = __gnu_cxx::operator!=
                                     ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                       *)in_stack_fffffffffffff9a0,
                                      (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                       *)in_stack_fffffffffffff998), bVar1) {
              __gnu_cxx::
              __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
              ::operator*(&local_348);
              std::
              vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
              ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                           *)in_stack_fffffffffffff9a0,(value_type *)in_stack_fffffffffffff998);
              __gnu_cxx::
              __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
              ::operator++(&local_348);
            }
            in_stack_fffffffffffffca0 = (Rewriter *)auStack_230;
            in_stack_fffffffffffffc98 =
                 std::
                 vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                 ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                          *)in_stack_fffffffffffff998);
            in_stack_fffffffffffffc90 =
                 std::
                 vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                 ::end((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                        *)in_stack_fffffffffffff998);
            while (bVar1 = __gnu_cxx::operator!=
                                     ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                       *)in_stack_fffffffffffff9a0,
                                      (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                       *)in_stack_fffffffffffff998),
                  in_stack_fffffffffffffc84 = local_cc, bVar1) {
              in_stack_fffffffffffffc88 =
                   (CallInst *)
                   __gnu_cxx::
                   __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                   ::operator*((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                *)&stack0xfffffffffffffc98);
              std::
              vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
              ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                           *)in_stack_fffffffffffff9a0,(value_type *)in_stack_fffffffffffff998);
              __gnu_cxx::
              __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
              ::operator++((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                            *)&stack0xfffffffffffffc98);
            }
            while( true ) {
              in_stack_fffffffffffffc84 = in_stack_fffffffffffffc84 + 1;
              uVar5 = (ulong)in_stack_fffffffffffffc84;
              sVar6 = std::
                      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      ::size(local_c0);
              if (sVar6 <= uVar5) break;
              std::
              vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
              ::operator[](local_c0,(long)in_stack_fffffffffffffc84);
              std::
              vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
              ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                           *)in_stack_fffffffffffff9a0,(value_type *)in_stack_fffffffffffff998);
            }
            std::
            vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ::clear((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                     *)0x156539);
            local_388 = local_320;
            local_390._M_current =
                 (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                 std::
                 vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                 ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                          *)in_stack_fffffffffffff998);
            local_398 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                        std::
                        vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                        ::end((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                               *)in_stack_fffffffffffff998);
            while (bVar1 = __gnu_cxx::operator!=
                                     ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                       *)in_stack_fffffffffffff9a0,
                                      (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                       *)in_stack_fffffffffffff998), bVar1) {
              local_3a0 = __gnu_cxx::
                          __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                          ::operator*(&local_390);
              std::
              vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
              ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                           *)in_stack_fffffffffffff9a0,(value_type *)in_stack_fffffffffffff998);
              __gnu_cxx::
              __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
              ::operator++(&local_390);
            }
            in_stack_fffffffffffff9e4 = (local_c8->jump).kind;
            std::optional<mir::inst::VarId>::optional
                      ((optional<mir::inst::VarId> *)in_stack_fffffffffffff9a0,
                       (optional<mir::inst::VarId> *)in_stack_fffffffffffff998);
            mir::inst::JumpInstruction::JumpInstruction
                      ((JumpInstruction *)in_stack_fffffffffffff9c0,
                       (JumpInstructionKind)((ulong)in_stack_fffffffffffff9b8._M_node >> 0x20),
                       (int)in_stack_fffffffffffff9b8._M_node,in_stack_fffffffffffff9b4,
                       (optional<mir::inst::VarId> *)
                       CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                       (JumpKind)((ulong)in_stack_fffffffffffff9a0 >> 0x20));
            mir::inst::JumpInstruction::operator=
                      ((JumpInstruction *)in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
            mir::inst::JumpInstruction::~JumpInstruction(&local_3d8);
            local_3f4 = (local_c8->jump).bb_true;
            if (local_3f4 != -1) {
              in_stack_fffffffffffff9d8 =
                   std::
                   map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                   ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                         *)in_stack_fffffffffffff9c0,(key_type *)in_stack_fffffffffffff9b8._M_node);
              local_400 = in_stack_fffffffffffff9d8;
              std::set<int,_std::less<int>,_std::allocator<int>_>::erase
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff9a0
                         ,(key_type *)in_stack_fffffffffffff998);
              pVar13 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                                 ((set<int,_std::less<int>,_std::allocator<int>_> *)
                                  in_stack_fffffffffffff9c0,
                                  (value_type_conflict3 *)in_stack_fffffffffffff9b8._M_node);
              in_stack_fffffffffffff9d0 = pVar13.first._M_node;
              in_stack_fffffffffffff9cf = pVar13.second;
              local_410 = in_stack_fffffffffffff9d0._M_node;
              local_408 = in_stack_fffffffffffff9cf;
            }
            local_414 = (local_c8->jump).bb_false;
            if (local_414 != -1) {
              in_stack_fffffffffffff9c0 =
                   (MirFunction *)
                   std::
                   map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                   ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                         *)in_stack_fffffffffffff9c0,(key_type *)in_stack_fffffffffffff9b8._M_node);
              local_420 = in_stack_fffffffffffff9c0;
              std::set<int,_std::less<int>,_std::allocator<int>_>::erase
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff9a0
                         ,(key_type *)in_stack_fffffffffffff998);
              pVar13 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                                 ((set<int,_std::less<int>,_std::allocator<int>_> *)
                                  in_stack_fffffffffffff9c0,
                                  (value_type_conflict3 *)in_stack_fffffffffffff9b8._M_node);
              in_stack_fffffffffffff9b8 = pVar13.first._M_node;
              local_428 = pVar13.second;
              in_stack_fffffffffffff9b4 = CONCAT13(local_428,(int3)in_stack_fffffffffffff9b4);
              local_448._M_right = in_stack_fffffffffffff9b8._M_node;
            }
            std::
            vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ::vector((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      *)0x1567c8);
            for (local_44c = 0; local_44c < local_cc; local_44c = local_44c + 1) {
              std::
              vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
              ::operator[](local_c0,(long)local_44c);
              std::
              vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
              ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                           *)in_stack_fffffffffffff9a0,(value_type *)in_stack_fffffffffffff998);
            }
            local_458 = auStack_248;
            local_460._M_current =
                 (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                 std::
                 vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                 ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                          *)in_stack_fffffffffffff998);
            local_468 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                        std::
                        vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                        ::end((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                               *)in_stack_fffffffffffff998);
            while (bVar1 = __gnu_cxx::operator!=
                                     ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                       *)in_stack_fffffffffffff9a0,
                                      (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                       *)in_stack_fffffffffffff998), bVar1) {
              local_470 = __gnu_cxx::
                          __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                          ::operator*(&local_460);
              std::
              vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
              ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                           *)in_stack_fffffffffffff9a0,(value_type *)in_stack_fffffffffffff998);
              __gnu_cxx::
              __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
              ::operator++(&local_460);
            }
            local_478 = &local_308->inst;
            local_480._M_current =
                 (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                 std::
                 vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                 ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                          *)in_stack_fffffffffffff998);
            local_488 = (_Base_ptr)
                        std::
                        vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                        ::end((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                               *)in_stack_fffffffffffff998);
            while (bVar1 = __gnu_cxx::operator!=
                                     ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                       *)in_stack_fffffffffffff9a0,
                                      (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                       *)in_stack_fffffffffffff998), bVar1) {
              local_490 = (_Base_ptr)
                          __gnu_cxx::
                          __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                          ::operator*(&local_480);
              std::
              vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
              ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                           *)in_stack_fffffffffffff9a0,(value_type *)in_stack_fffffffffffff998);
              __gnu_cxx::
              __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
              ::operator++(&local_480);
            }
            std::
            vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ::clear((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                     *)0x156982);
            local_498 = &local_448;
            local_4a0._M_current =
                 (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                 std::
                 vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                 ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                          *)in_stack_fffffffffffff998);
            local_4e8._64_8_ =
                 std::
                 vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                 ::end((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                        *)in_stack_fffffffffffff998);
            while (bVar1 = __gnu_cxx::operator!=
                                     ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                       *)in_stack_fffffffffffff9a0,
                                      (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                       *)in_stack_fffffffffffff998), bVar1) {
              local_4e8._56_8_ =
                   __gnu_cxx::
                   __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                   ::operator*(&local_4a0);
              std::
              vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
              ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                           *)in_stack_fffffffffffff9a0,(value_type *)in_stack_fffffffffffff998);
              __gnu_cxx::
              __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
              ::operator++(&local_4a0);
            }
            in_stack_fffffffffffff9a8 = (local_308->jump).kind;
            in_stack_fffffffffffff9ac = (local_308->jump).bb_true;
            in_stack_fffffffffffff9b0 = (local_308->jump).bb_false;
            std::optional<mir::inst::VarId>::optional
                      ((optional<mir::inst::VarId> *)in_stack_fffffffffffff9a0,
                       (optional<mir::inst::VarId> *)in_stack_fffffffffffff998);
            mir::inst::JumpInstruction::JumpInstruction
                      ((JumpInstruction *)in_stack_fffffffffffff9c0,
                       (JumpInstructionKind)((ulong)in_stack_fffffffffffff9b8._M_node >> 0x20),
                       (int)in_stack_fffffffffffff9b8._M_node,in_stack_fffffffffffff9b4,
                       (optional<mir::inst::VarId> *)
                       CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                       (JumpKind)((ulong)in_stack_fffffffffffff9a0 >> 0x20));
            in_stack_fffffffffffff9a0 = (Rewriter *)local_4e8;
            mir::inst::JumpInstruction::operator=
                      ((JumpInstruction *)in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
            mir::inst::JumpInstruction::~JumpInstruction
                      ((JumpInstruction *)in_stack_fffffffffffff9a0);
            local_b1 = 1;
            std::
            map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
            ::erase((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                     *)in_stack_fffffffffffff9a0,(key_type *)in_stack_fffffffffffff998);
            std::
            vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ::~vector((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
            std::
            vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ::~vector((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
            Rewriter::~Rewriter(in_stack_fffffffffffff9a0);
          }
          if ((local_b1 & 1) != 0) {
            ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                               ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
                                0x156b40);
            local_24 = ppVar4->first;
            break;
          }
        }
        std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator++
                  ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
                   in_stack_fffffffffffff9a0);
      }
      local_508[0]._M_node =
           (_Base_ptr)
           std::
           map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
           ::end((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                  *)in_stack_fffffffffffff998);
      bVar1 = std::operator==(&local_a8,local_508);
    } while (!bVar1);
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)0x156ba7);
  }
  return;
LAB_00156b13:
  local_cc = local_cc + 1;
  goto LAB_00155bd5;
}

Assistant:

void optimize_func(std::string funcId, mir::inst::MirFunction& func,
                     std::map<std::string, mir::inst::MirFunction>& funcTable) {
    if (func.name == "main" || func.type->is_extern) {
      return;
    }
    int cur_blkId = func.basic_blks.begin()->first;
    std::set<mir::types::LabelId> base_labels;
    for (auto& iter : func.basic_blks) {
      base_labels.insert(iter.first);
    }
    while (true) {
      auto iter = func.basic_blks.begin();
      for (; iter != func.basic_blks.end(); ++iter) {
        bool flag = false;
        if (iter->first < cur_blkId) {
          // if (iter->first < cur_blkId || !base_labels.count(iter->first)) {

          continue;
        }
        auto& insts = iter->second.inst;
        auto& cur_blk = iter->second;
        for (int i = 0; i < insts.size(); i++) {
          auto& inst = insts[i];
          if (inst->inst_kind() != mir::inst::InstKind::Call) {
            continue;
          }
          auto& iptr = *inst;
          auto callInst = dynamic_cast<mir::inst::CallInst*>(&iptr);
          auto& subfunc = funcTable.at(callInst->func);
          if (uninlineable_funcs.count(subfunc.name)) {
            continue;
          }
          if (subfunc.type->is_extern) {
            continue;
          }
          if (subfunc.variable_table_size() + func.variable_table_size() >=
              1024) {
            uninlined_funcs.insert(subfunc.name);
            continue;
          }
          //  Then this func is inlineable
          LOG(TRACE) << "( inline_func ) " << func.name << " inlines "
                     << subfunc.name << std::endl;
          Rewriter rwt(func, subfunc, *callInst, cur_blk.id);
          for (auto& pair : subfunc.basic_blks) {
            rwt.cast_block(pair.second);
          }
          auto sub_start_id =
              rwt.label_cast_map.at(subfunc.basic_blks.begin()->first);
          auto end_iter = subfunc.basic_blks.end();
          end_iter--;
          auto sub_end_id = rwt.label_cast_map.at(end_iter->first);
          auto& start_blk = func.basic_blks.at(sub_start_id);

          std::vector<std::unique_ptr<mir::inst::Inst>> end_blk_insts;
          auto& end_blk = func.basic_blks.at(sub_end_id);
          base_labels.insert(sub_end_id);
          for (auto& j : end_blk.inst) {
            end_blk_insts.push_back(std::move(j));
          }

          for (auto& j : rwt.init_inst_after) {
            end_blk_insts.push_back(std::move(j));
          }
          for (int j = i + 1; j < insts.size(); j++) {
            end_blk_insts.push_back(std::move(insts[j]));
          }
          end_blk.inst.clear();
          for (auto& j : end_blk_insts) {
            end_blk.inst.push_back(std::move(j));
          }
          end_blk.jump = mir::inst::JumpInstruction(
              cur_blk.jump.kind, cur_blk.jump.bb_true, cur_blk.jump.bb_false,
              cur_blk.jump.cond_or_ret, cur_blk.jump.jump_kind);
          int bb_true = cur_blk.jump.bb_true;
          if (bb_true != -1) {
            auto& blk = func.basic_blks.at(bb_true);
            blk.preceding.erase(cur_blk.id);
            blk.preceding.insert(end_blk.id);
          }
          int bb_false = cur_blk.jump.bb_false;
          if (bb_false != -1) {
            auto& blk = func.basic_blks.at(bb_false);
            blk.preceding.erase(cur_blk.id);
            blk.preceding.insert(end_blk.id);
          }

          std::vector<std::unique_ptr<mir::inst::Inst>> start_blk_insts;
          for (int j = 0; j < i; j++) {
            start_blk_insts.push_back(std::move(insts[j]));
          }
          for (auto& j : rwt.init_inst_before) {
            start_blk_insts.push_back(std::move(j));
          }
          for (auto& j : start_blk.inst) {
            start_blk_insts.push_back(std::move(j));
          }
          cur_blk.inst.clear();
          for (auto& j : start_blk_insts) {
            cur_blk.inst.push_back(std::move(j));
          }
          cur_blk.jump = mir::inst::JumpInstruction(
              start_blk.jump.kind, start_blk.jump.bb_true,
              start_blk.jump.bb_false, start_blk.jump.cond_or_ret,
              start_blk.jump.jump_kind);

          flag = true;
          func.basic_blks.erase(sub_start_id);
          break;
        }
        if (flag) {
          cur_blkId = iter->first;
          break;
        }
      }
      if (iter == func.basic_blks.end()) {
        break;
      }
    }
  }